

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O2

void TranslateFunctionName(ExpressionTranslateContext *ctx,FunctionData *function)

{
  ScopeData *pSVar1;
  TypeBase *pTVar2;
  MatchData *pMVar3;
  InplaceStr name;
  InplaceStr name_00;
  InplaceStr IVar4;
  ulong uVar5;
  char *unaff_RBX;
  FunctionData *pFVar6;
  char *pcVar7;
  char *pcVar8;
  IntrusiveList<MatchData> *pIVar9;
  InplaceStr name_01;
  InplaceStr namePart;
  char *local_40;
  char *in_stack_ffffffffffffffc8;
  
  pcVar8 = (function->name->name).begin;
  pcVar7 = (function->name->name).end;
  pFVar6 = function->implementation;
  if (function->implementation == (FunctionData *)0x0) {
    pFVar6 = function;
  }
  if (*pcVar8 == '$') {
    Print(ctx,"__");
    InplaceStr::InplaceStr((InplaceStr *)&local_40,pcVar8 + 1,pcVar7);
    pcVar7 = in_stack_ffffffffffffffc8;
    pcVar8 = local_40;
    in_stack_ffffffffffffffc8 = pcVar7;
  }
  IVar4.end = pcVar7;
  IVar4.begin = pcVar8;
  name.end = unaff_RBX;
  name.begin = in_stack_ffffffffffffffc8;
  name_01 = GetOperatorName(name);
  if (name_01.begin == name_01.end) {
    name_01 = IVar4;
  }
  pcVar7 = name_01.end;
  pcVar8 = name_01.begin;
  pSVar1 = pFVar6->scope;
  pTVar2 = pSVar1->ownerType;
  if (pTVar2 == (TypeBase *)0x0) {
    if (((pSVar1 != ctx->ctx->globalScope) && (pSVar1->ownerNamespace == (NamespaceData *)0x0)) ||
       (pFVar6->isHidden != false)) {
      PrintEscapedName(ctx,name_01);
      pIVar9 = &pFVar6->generics;
      while (pMVar3 = pIVar9->head, pMVar3 != (MatchData *)0x0) {
        Print(ctx,"_");
        PrintEscapedTypeName(ctx,pMVar3->type);
        Print(ctx,"_");
        pIVar9 = (IntrusiveList<MatchData> *)&pMVar3->next;
      }
      Print(ctx,"_%d",(ulong)pFVar6->functionIndex);
      goto LAB_0013d0cc;
    }
    PrintEscapedName(ctx,name_01);
    pIVar9 = &pFVar6->generics;
    while( true ) {
      pMVar3 = pIVar9->head;
      Print(ctx,"_");
      if (pMVar3 == (MatchData *)0x0) break;
      PrintEscapedTypeName(ctx,pMVar3->type);
      Print(ctx,"_");
      pIVar9 = (IntrusiveList<MatchData> *)&pMVar3->next;
    }
  }
  else {
    uVar5 = (long)(pTVar2->name).end - (long)(pTVar2->name).begin;
    if ((int)uVar5 + 2U < (uint)((int)name_01.end - (int)name_01.begin)) {
      InplaceStr::InplaceStr((InplaceStr *)&local_40,pcVar8 + (uVar5 & 0xffffffff) + 2,pcVar7);
      name_00.end = unaff_RBX;
      name_00.begin = in_stack_ffffffffffffffc8;
      name_01 = GetOperatorName(name_00);
      PrintEscapedTypeName(ctx,pFVar6->scope->ownerType);
      Print(ctx,"__");
      if (name_01.begin == name_01.end) {
        name_01.end = in_stack_ffffffffffffffc8;
        name_01.begin = local_40;
      }
    }
    PrintEscapedName(ctx,name_01);
    pIVar9 = &pFVar6->generics;
    while( true ) {
      pMVar3 = pIVar9->head;
      Print(ctx,"_");
      if (pMVar3 == (MatchData *)0x0) break;
      PrintEscapedTypeName(ctx,pMVar3->type);
      Print(ctx,"_");
      pIVar9 = (IntrusiveList<MatchData> *)&pMVar3->next;
    }
  }
  PrintEscapedName(ctx,(pFVar6->type->super_TypeBase).name);
LAB_0013d0cc:
  if ((pcVar8 != pcVar7) && (pcVar7[-1] == '$')) {
    Print(ctx,"_");
  }
  return;
}

Assistant:

void TranslateFunctionName(ExpressionTranslateContext &ctx, FunctionData *function)
{
	InplaceStr name = function->name->name;

	if(function->implementation)
		function = function->implementation;

	if(*name.begin == '$')
	{
		Print(ctx, "__");

		name = InplaceStr(name.begin + 1, name.end);
	}

	InplaceStr operatorName = GetOperatorName(name);

	if(!operatorName.empty())
		name = operatorName;

	if(function->scope->ownerType)
	{
		if(name.length() > function->scope->ownerType->name.length() + 2)
		{
			InplaceStr namePart = InplaceStr(name.begin + function->scope->ownerType->name.length() + 2, name.end);
			InplaceStr operatorName = GetOperatorName(namePart);

			if(!operatorName.empty())
			{
				PrintEscapedTypeName(ctx, function->scope->ownerType);
				Print(ctx, "__");
				PrintEscapedName(ctx, operatorName);
			}
			else
			{
				PrintEscapedTypeName(ctx, function->scope->ownerType);
				Print(ctx, "__");
				PrintEscapedName(ctx, namePart);
			}
		}
		else
		{
			PrintEscapedName(ctx, name);
		}

		for(MatchData *alias = function->generics.head; alias; alias = alias->next)
		{
			Print(ctx, "_");
			PrintEscapedTypeName(ctx, alias->type);
			Print(ctx, "_");
		}

		Print(ctx, "_");
		PrintEscapedName(ctx, function->type->name);
	}
	else if((function->scope == ctx.ctx.globalScope || function->scope->ownerNamespace) && !function->isHidden)
	{
		PrintEscapedName(ctx, name);

		for(MatchData *alias = function->generics.head; alias; alias = alias->next)
		{
			Print(ctx, "_");
			PrintEscapedTypeName(ctx, alias->type);
			Print(ctx, "_");
		}

		Print(ctx, "_");
		PrintEscapedName(ctx, function->type->name);
	}
	else
	{
		PrintEscapedName(ctx, name);

		for(MatchData *alias = function->generics.head; alias; alias = alias->next)
		{
			Print(ctx, "_");
			PrintEscapedTypeName(ctx, alias->type);
			Print(ctx, "_");
		}

		Print(ctx, "_%d", function->functionIndex);
	}

	if(!name.empty() && *(name.end - 1) == '$')
		Print(ctx, "_");
}